

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

void __thiscall ddd::DaTrie<true,_true,_false>::pack_bc(DaTrie<true,_true,_false> *this)

{
  pointer pBVar1;
  uint32_t base;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  bool bVar5;
  Query query;
  Query local_148;
  Edge local_130;
  
  local_148.key_ = (char *)0x0;
  local_148.pos_ = 0;
  local_148.value_ = 0x7fffffff;
  local_148.node_pos_ = 0;
  local_148.is_finished_ = false;
  memset(&local_130,0,0x108);
  if (0xff < this->bc_emps_) {
    do {
      pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = (ulong)((long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pBVar1) >> 3;
      uVar4 = 0;
      do {
        uVar2 = (int)uVar3 - 1;
        uVar3 = (ulong)uVar2;
        if ((long)pBVar1[uVar3] < 0) break;
        bVar5 = uVar4 < 0xff;
        uVar4 = uVar4 + 1;
      } while (bVar5);
      if (-1 < (long)pBVar1[uVar2]) {
        __assert_fail("bc_[max_pos].is_fixed()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                      ,0xba,
                      "void ddd::DaTrie<true, true, false>::pack_bc() [WithBLM = true, WithNLM = true, Prefix = false]"
                     );
      }
      local_148.node_pos_ = SUB84(pBVar1[uVar2],4) & 0x7fffffff;
      edge_(this,local_148.node_pos_,&local_130,0x100);
      base = excheck_(this,&local_130,&this->blocks_);
      if (base == 0xffffffff) {
        return;
      }
      shelter_(this,base,&local_130,&local_148);
      move_(this,local_148.node_pos_,base,&local_130,&local_148);
    } while (0xff < this->bc_emps_);
  }
  return;
}

Assistant:

void pack_bc() {
    assert(!Prefix);

    Query query;
    Edge edge;

    while (BLOCK_SIZE <= bc_emps()) {
      auto max_pos = bc_size();
      for (uint32_t i = 0; i < BLOCK_SIZE; ++i) {
        if (bc_[--max_pos].is_fixed()) {
          break;
        }
      }
      assert(bc_[max_pos].is_fixed());

      query.set_node_pos(bc_[max_pos].check());
      edge_(query.node_pos(), edge);

      auto base = excheck_(edge, blocks_);
      if (base == NOT_FOUND) {
        break;
      }

      shelter_(base, edge, query);
      move_(query.node_pos(), base, edge, query);
    }
  }